

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPStateImp.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
TSPStateImp::Neighbor(TSPStateImp *this,vector<int,_std::allocator<int>_> *currentState)

{
  int iVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar3;
  int iVar4;
  pointer piVar5;
  
  this_00 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar1 = rand();
  iVar1 = iVar1 % this->n;
  iVar2 = rand();
  iVar2 = iVar2 % this->n;
  iVar4 = iVar2;
  if (iVar1 < iVar2) {
    iVar4 = iVar1;
  }
  piVar3 = (currentState->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (piVar5 = piVar3; piVar5 != piVar3 + iVar4; piVar5 = piVar5 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back(this_00,piVar5);
    piVar3 = (currentState->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  for (piVar5 = piVar3 + iVar2; piVar5 != piVar3 + (long)iVar4 + -1; piVar5 = piVar5 + -1) {
    std::vector<int,_std::allocator<int>_>::push_back(this_00,piVar5);
    piVar3 = (currentState->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  piVar3 = piVar3 + iVar2;
  while (piVar3 = piVar3 + 1,
        piVar3 != (currentState->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
    std::vector<int,_std::allocator<int>_>::push_back(this_00,piVar3);
  }
  return this_00;
}

Assistant:

std::vector<int> *TSPStateImp::Neighbor(std::vector<int> *currentState)
{
	std::vector<int> *newState = new std::vector<int>;

	int u = rand() % n, v = rand() % n;

	if (u > v)
	{
		std::swap(u, v);
	}

	for (auto iter = currentState->begin(); iter != currentState->begin() + u; ++iter)
	{
		newState->push_back(*iter);
	}

	for (auto iter = currentState->begin() + v; iter != currentState->begin() + u - 1; --iter)
	{
		newState->push_back(*iter);
	}

	for (auto iter = currentState->begin() + v + 1; iter != currentState->end(); ++iter)
	{
		newState->push_back(*iter);
	}

	return newState;
}